

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_result_modifier.cpp
# Opt level: O1

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> __thiscall
duckdb::OrderModifier::Deserialize(OrderModifier *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  pointer pOVar3;
  undefined4 extraout_var;
  long lVar4;
  unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true> result;
  OrderByNode val;
  _Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_> local_80;
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_78;
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_58;
  _Head_base<0UL,_duckdb::ResultModifier_*,_false> local_38;
  
  local_80.super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::OrderModifier_*,_false>)operator_new(0x28);
  (((OrderModifier *)local_80.super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl)->
  super_ResultModifier).type = ORDER_MODIFIER;
  (((OrderModifier *)local_80.super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl)->
  super_ResultModifier)._vptr_ResultModifier = (_func_int **)&PTR__OrderModifier_019933b0;
  (((OrderModifier *)local_80.super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl)->
  orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((OrderModifier *)local_80.super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl)->
  orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((OrderModifier *)local_80.super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl)->
  orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar3 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
           operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                       *)&local_80);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"orders");
  if ((char)uVar1 == '\0') {
    local_78.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_78);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_58);
  }
  else {
    local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38._M_head_impl = &this->super_ResultModifier;
    iVar2 = (*deserializer->_vptr_Deserializer[8])(deserializer);
    lVar4 = CONCAT44(extraout_var,iVar2);
    if (lVar4 != 0) {
      do {
        (*deserializer->_vptr_Deserializer[6])(deserializer);
        OrderByNode::Deserialize((OrderByNode *)&local_78,deserializer);
        (*deserializer->_vptr_Deserializer[7])(deserializer);
        ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::
        emplace_back<duckdb::OrderByNode>(&local_58,(OrderByNode *)&local_78);
        if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)
            local_78.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
          (*((BaseExpression *)
            &(local_78.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_finish)->type)->_vptr_BaseExpression[1])();
        }
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    (*deserializer->_vptr_Deserializer[9])(deserializer);
    local_78.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pOVar3->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_78);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_58);
    this = (OrderModifier *)local_38._M_head_impl;
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  *(_Head_base<0UL,_duckdb::OrderModifier_*,_false> *)this =
       local_80.super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (__uniq_ptr_impl<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)this
  ;
}

Assistant:

unique_ptr<ResultModifier> OrderModifier::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<OrderModifier>(new OrderModifier());
	deserializer.ReadPropertyWithDefault<vector<OrderByNode>>(200, "orders", result->orders);
	return std::move(result);
}